

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildReservedRange
          (DescriptorBuilder *this,EnumReservedRange *proto,EnumDescriptor *parent,
          ReservedRange *result)

{
  int32 iVar1;
  int *in_RCX;
  EnumDescriptor *in_RDX;
  char *in_stack_00000040;
  ErrorLocation in_stack_0000004c;
  Message *in_stack_00000050;
  string *in_stack_00000058;
  DescriptorBuilder *in_stack_00000060;
  
  iVar1 = EnumDescriptorProto_EnumReservedRange::start
                    ((EnumDescriptorProto_EnumReservedRange *)0x4bb82b);
  *in_RCX = iVar1;
  iVar1 = EnumDescriptorProto_EnumReservedRange::end
                    ((EnumDescriptorProto_EnumReservedRange *)0x4bb83e);
  in_RCX[1] = iVar1;
  if (in_RCX[1] < *in_RCX) {
    EnumDescriptor::full_name_abi_cxx11_(in_RDX);
    AddError(in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_0000004c,
             in_stack_00000040);
  }
  return;
}

Assistant:

void DescriptorBuilder::BuildReservedRange(
    const EnumDescriptorProto::EnumReservedRange& proto,
    const EnumDescriptor* parent, EnumDescriptor::ReservedRange* result) {
  result->start = proto.start();
  result->end = proto.end();

  if (result->start > result->end) {
    AddError(parent->full_name(), proto, DescriptorPool::ErrorCollector::NUMBER,
             "Reserved range end number must be greater than start number.");
  }
}